

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Status read_sqsh_header(FILE *fp,SqshHeader *header)

{
  int iVar1;
  Word WVar2;
  size_t sVar3;
  SqshHeader *header_local;
  FILE *fp_local;
  
  sVar3 = fread(header,1,4,(FILE *)fp);
  if (sVar3 == 4) {
    iVar1 = strncmp(header->magic,"SQSH",4);
    if (iVar1 == 0) {
      WVar2 = read_word(fp);
      header->origlen = WVar2;
      WVar2 = read_word(fp);
      header->load = WVar2;
      WVar2 = read_word(fp);
      header->exec = WVar2;
      WVar2 = read_word(fp);
      header->reserved = WVar2;
      fp_local._4_4_ = NOERR;
    }
    else {
      error("Not a RISC OS squash file");
      fp_local._4_4_ = RERR;
    }
  }
  else {
    fp_local._4_4_ = RERR;
  }
  return fp_local._4_4_;
}

Assistant:

Status
read_sqsh_header(FILE *fp, SqshHeader *header)
{
	if (fread(header->magic, 1, 4, fp) != 4)
	{
		return RERR;
	}
	if (strncmp(header->magic, "SQSH", 4) != 0)
	{
		error("Not a RISC OS squash file");
		return RERR;
	}
	header->origlen = read_word(fp);
	header->load = read_word(fp);
	header->exec = read_word(fp);
	header->reserved = read_word(fp);

	return NOERR;
}